

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsingleshottimer.cpp
# Opt level: O2

void __thiscall
QSingleShotTimer::startTimerForReceiver
          (QSingleShotTimer *this,Duration interval,TimerType timerType,QObject *receiver)

{
  QThread *pQVar1;
  QThread *pQVar2;
  StartTimerEvent *this_00;
  long in_FS_OFFSET;
  QDeadlineTimer local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (receiver != (QObject *)0x0) {
    pQVar1 = QObject::thread(receiver);
    pQVar2 = QObject::thread((QObject *)this);
    if (pQVar1 != pQVar2) {
      *(uint *)(*(long *)(this + 8) + 0x30) = *(uint *)(*(long *)(this + 8) + 0x30) & 0xffffffef;
      QObject::setParent((QObject *)this,(QObject *)0x0);
      pQVar1 = QObject::thread(receiver);
      QObject::moveToThread((QObject *)this,pQVar1);
      this_00 = (StartTimerEvent *)operator_new(0x30);
      QDeadlineTimer::QDeadlineTimer<long,std::ratio<1l,1000000000l>>
                (&local_40,(duration<long,_std::ratio<1L,_1000000000L>_>)interval.__r,timerType);
      StartTimerEvent::StartTimerEvent(this_00,(QSingleShotTimer *)this,&local_40);
      QCoreApplication::postEvent((QObject *)this,(QEvent *)this_00,0);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        return;
      }
      goto LAB_0029dac6;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    QBasicTimer::start((QBasicTimer *)(this + 0x10),(Duration)interval.__r,timerType,(QObject *)this
                      );
    return;
  }
LAB_0029dac6:
  __stack_chk_fail();
}

Assistant:

void QSingleShotTimer::startTimerForReceiver(Duration interval, Qt::TimerType timerType,
                                             const QObject *receiver)
{
    if (receiver && receiver->thread() != thread()) {
        QObjectPrivate *d_ptr = QObjectPrivate::get(this);
        d_ptr->sendChildEvents = false;

        setParent(nullptr);
        moveToThread(receiver->thread());

        QCoreApplication::postEvent(this,
                                    new StartTimerEvent(this, QDeadlineTimer(interval, timerType)));
        // the event owns "this" and is handled concurrently, so unsafe to
        // access "this" beyond this point
    } else {
        timer.start(interval, timerType, this);
    }
}